

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableRawRepeatedField
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,CppType cpptype,
          int ctype,Descriptor *desc)

{
  int number;
  bool bVar1;
  Type TVar2;
  uint32 uVar3;
  LogMessage *pLVar4;
  Descriptor *pDVar5;
  MapFieldBase *this_00;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"\"MutableRawRepeatedField\"",
               "Field is singular; the method requires a repeated field.");
  }
  TVar2 = FieldDescriptor::type(field);
  if (*(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != cpptype) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableRawRepeatedField",cpptype);
  }
  if ((-1 < ctype) && (*(int *)(*(long *)(field + 0x80) + 0x68) != ctype)) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x6ae);
    pLVar4 = LogMessage::operator<<
                       (&local_68,"CHECK failed: (field->options().ctype()) == (ctype): ");
    pLVar4 = LogMessage::operator<<(pLVar4,"subtype mismatch");
    LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
    LogMessage::~LogMessage(&local_68);
  }
  if ((desc != (Descriptor *)0x0) && (pDVar5 = FieldDescriptor::message_type(field), pDVar5 != desc)
     ) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x6b0);
    pLVar4 = LogMessage::operator<<(&local_a0,"CHECK failed: (field->message_type()) == (desc): ");
    pLVar4 = LogMessage::operator<<(pLVar4,"wrong submessage type");
    LogFinisher::operator=(&local_a1,pLVar4);
    LogMessage::~LogMessage(&local_a0);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    TVar2 = FieldDescriptor::type(field);
    bVar1 = FieldDescriptor::is_packed(field);
    this_00 = (MapFieldBase *)
              ExtensionSet::MutableRawRepeatedField
                        ((ExtensionSet *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                         number,(FieldType)TVar2,bVar1,field);
  }
  else {
    bVar1 = FieldDescriptor::is_map(field);
    uVar3 = ReflectionSchema::GetFieldOffsetNonOneof(&this->schema_,field);
    this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3)
    ;
    if (bVar1) {
      this_00 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_00);
    }
  }
  return this_00;
}

Assistant:

void* GeneratedMessageReflection::MutableRawRepeatedField(
    Message* message, const FieldDescriptor* field,
    FieldDescriptor::CppType cpptype,
    int ctype, const Descriptor* desc) const {
  USAGE_CHECK_REPEATED("MutableRawRepeatedField");
  if (field->cpp_type() != cpptype)
    ReportReflectionUsageTypeError(descriptor_,
        field, "MutableRawRepeatedField", cpptype);
  if (ctype >= 0)
    GOOGLE_CHECK_EQ(field->options().ctype(), ctype) << "subtype mismatch";
  if (desc != NULL)
    GOOGLE_CHECK_EQ(field->message_type(), desc) << "wrong submessage type";
  if (field->is_extension()) {
    return MutableExtensionSet(message)->MutableRawRepeatedField(
        field->number(), field->type(), field->is_packed(), field);
  } else {
    // Trigger transform for MapField
    if (IsMapFieldInApi(field)) {
      return MutableRawNonOneof<MapFieldBase>(message, field)
          ->MutableRepeatedField();
    }
    return MutableRawNonOneof<void>(message, field);
  }
}